

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_3_3::Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(IStream *in,int *v)

{
  IStream *in_RSI;
  char b [4];
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  
  readSignedChars<Imf_3_3::StreamIO,Imf_3_3::IStream>
            (in_RSI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                     CONCAT16(in_stack_ffffffffffffffee,
                                              CONCAT15(in_stack_ffffffffffffffed,
                                                       CONCAT14(in_stack_ffffffffffffffec,
                                                                in_stack_ffffffffffffffe8)))),0);
  *(uint *)&in_RSI->_vptr_IStream =
       CONCAT13(in_stack_ffffffffffffffef,
                CONCAT12(in_stack_ffffffffffffffee,
                         CONCAT11(in_stack_ffffffffffffffed,in_stack_ffffffffffffffec)));
  return;
}

Assistant:

void
read (T& in, signed int& v)
{
    signed char b[4];

    readSignedChars<S> (in, b, 4);

    v = (static_cast<unsigned char> (b[0]) & 0x000000ff) |
        ((static_cast<unsigned char> (b[1]) << 8) & 0x0000ff00) |
        ((static_cast<unsigned char> (b[2]) << 16) & 0x00ff0000) |
        (static_cast<unsigned char> (b[3]) << 24);
}